

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transition.cc
# Opt level: O0

bool tchecker::syncprod::operator==(transition_t *t1,transition_t *t2)

{
  bool bVar1;
  sync_id_t sVar2;
  sync_id_t sVar3;
  make_array_t<unsigned_int,_4UL,_tchecker::vedge_base_t> *a1;
  make_array_t<unsigned_int,_4UL,_tchecker::vedge_base_t> *a2;
  undefined1 local_19;
  transition_t *t2_local;
  transition_t *t1_local;
  
  bVar1 = ts::operator==((transition_t *)t1,(transition_t *)t2);
  local_19 = false;
  if (bVar1) {
    sVar2 = transition_t::sync_id(t1);
    sVar3 = transition_t::sync_id(t2);
    local_19 = false;
    if (sVar2 == sVar3) {
      a1 = &transition_t::vedge(t1)->super_edge_array_t;
      a2 = &transition_t::vedge(t2)->super_edge_array_t;
      local_19 = tchecker::operator==(a1,a2);
    }
  }
  return local_19;
}

Assistant:

bool operator==(tchecker::syncprod::transition_t const & t1, tchecker::syncprod::transition_t const & t2)
{
  return (static_cast<tchecker::ts::transition_t const &>(t1) == static_cast<tchecker::ts::transition_t const &>(t2) &&
          (t1.sync_id() == t2.sync_id()) && (t1.vedge() == t2.vedge()));
}